

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O3

int Mio_CommandReadGenlib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  FILE *__stream_00;
  Mio_Library_t *pLib;
  Amap_Lib_t *pLib_00;
  char *pcVar4;
  uint uVar5;
  size_t __size;
  int level;
  char *pcVar6;
  double dVar7;
  double Shift;
  char *local_38;
  
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  local_38 = (char *)0x0;
  Extra_UtilGetoptReset();
  uVar5 = 1;
  Shift = 0.0;
  bVar1 = false;
  do {
    while( true ) {
      while (level = argc, iVar3 = Extra_UtilGetopt(argc,argv,"WEnvh"), iVar2 = globalUtilOptind,
            iVar3 == 0x76) {
        uVar5 = uVar5 ^ 1;
      }
      if (iVar3 < 0x57) break;
      if (iVar3 == 0x6e) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar3 != 0x57) goto LAB_00404a15;
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-W\" should be followed by a floating point number.\n";
          goto LAB_00404a08;
        }
        dVar7 = atof(argv[globalUtilOptind]);
        Shift = (double)(float)dVar7;
        globalUtilOptind = iVar2 + 1;
        if ((float)dVar7 <= 0.0) {
LAB_00404a15:
          fwrite("usage: read_genlib [-W float] [-E filename] [-nvh]\n",0x33,1,__stream);
          fwrite("\t           read the library from a genlib file\n",0x30,1,__stream);
          fwrite("\t           (if the library contains more than one gate\n",0x38,1,__stream);
          fwrite("\t           with the same Boolean function, only the gate\n",0x3a,1,__stream);
          fwrite("\t           with the smallest area will be used)\n",0x31,1,__stream);
          fprintf(__stream,
                  "\t-W float : wire delay (added to pin-to-pin gate delays) [default = %g]\n",Shift
                 );
          fwrite("\t-E file :  the file name with gates to be excluded [default = none]\n",0x45,1,
                 __stream);
          pcVar6 = "yes";
          pcVar4 = "yes";
          if (!bVar1) {
            pcVar4 = "no";
          }
          fprintf(__stream,
                  "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n",
                  pcVar4);
          if (uVar5 == 0) {
            pcVar6 = "no";
          }
          fprintf(__stream,"\t-v       : toggle verbose printout [default = %s]\n",pcVar6);
          pcVar4 = "\t-h       : enable verbose output\n";
          __size = 0x22;
LAB_00404b24:
          fwrite(pcVar4,__size,1,__stream);
          return 1;
        }
      }
    }
    if (iVar3 == -1) {
      if (globalUtilOptind + 1 == argc) {
        pcVar4 = argv[globalUtilOptind];
        __stream_00 = (FILE *)Io_FileOpen(pcVar4,"open_path","r",0);
        if (__stream_00 == (FILE *)0x0) {
          fprintf(__stream,"Cannot open input file \"%s\". ",pcVar4);
          pcVar4 = Extra_FileGetSimilarName(pcVar4,".genlib",".lib",".scl",".g",(char *)0x0);
          if (pcVar4 != (char *)0x0) {
            fprintf(__stream,"Did you mean \"%s\"?",pcVar4);
          }
          fputc(10,__stream);
          return 1;
        }
        fclose(__stream_00);
        pLib = Mio_LibraryRead(pcVar4,(char *)0x0,local_38,uVar5);
        if (pLib == (Mio_Library_t *)0x0) {
          pcVar4 = "Reading genlib library has failed.\n";
          __size = 0x23;
        }
        else {
          if (uVar5 != 0) {
            uVar5 = Mio_LibraryReadGateNum(pLib);
            printf("Entered genlib library with %d gates from file \"%s\".\n",(ulong)uVar5,pcVar4);
          }
          if (bVar1) {
            Mio_LibraryShortNames(pLib);
          }
          if ((Shift != 0.0) || (NAN(Shift))) {
            Mio_LibraryShiftDelay(pLib,Shift);
          }
          Mio_UpdateGenlib(pLib);
          pLib_00 = Amap_LibReadAndPrepare(pcVar4,(char *)0x0,0,0);
          if (pLib_00 != (Amap_Lib_t *)0x0) {
            Abc_FrameSetLibGen2(pLib_00);
            return 0;
          }
          pcVar4 = "Reading second genlib library has failed.\n";
          __size = 0x2a;
        }
        goto LAB_00404b24;
      }
      goto LAB_00404a15;
    }
    if (iVar3 != 0x45) goto LAB_00404a15;
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-E\" should be followed by a file name.\n";
LAB_00404a08:
      Abc_Print(level,pcVar4);
      goto LAB_00404a15;
    }
    local_38 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  } while( true );
}

Assistant:

int Mio_CommandReadGenlib( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Mio_Library_t * pLib;
    Amap_Lib_t * pLib2;
    char * pFileName;
    char * pExcludeFile = NULL;
    double WireDelay = 0.0;
    int fShortNames = 0;
    int c, fVerbose = 1;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "WEnvh")) != EOF ) 
    {
        switch (c) 
        {
            case 'W':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                    goto usage;
                }
                WireDelay = (float)atof(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( WireDelay <= 0.0 ) 
                    goto usage;
                break;
            case 'E':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-E\" should be followed by a file name.\n" );
                    goto usage;
                }
                pExcludeFile = argv[globalUtilOptind];
                globalUtilOptind++;
                break;
            case 'n':
                fShortNames ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "r", 0 )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".genlib", ".lib", ".scl", ".g", NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", pFileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pLib = Mio_LibraryRead( pFileName, NULL, pExcludeFile, fVerbose );  
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading genlib library has failed.\n" );
        return 1;
    }
    if ( fVerbose )
        printf( "Entered genlib library with %d gates from file \"%s\".\n", Mio_LibraryReadGateNum(pLib), pFileName );

    // convert the library if needed
    if ( fShortNames )
        Mio_LibraryShortNames( pLib );

    // add the fixed number (wire delay) to all delays in the library
    if ( WireDelay != 0.0 )
        Mio_LibraryShiftDelay( pLib, WireDelay );

    // prepare libraries
    Mio_UpdateGenlib( pLib );

    // replace the current library
    pLib2 = Amap_LibReadAndPrepare( pFileName, NULL, 0, 0 );  
    if ( pLib2 == NULL )
    {
        fprintf( pErr, "Reading second genlib library has failed.\n" );
        return 1;
    }
    Abc_FrameSetLibGen2( pLib2 );
    return 0;

usage:
    fprintf( pErr, "usage: read_genlib [-W float] [-E filename] [-nvh]\n");
    fprintf( pErr, "\t           read the library from a genlib file\n" );  
    fprintf( pErr, "\t           (if the library contains more than one gate\n" );  
    fprintf( pErr, "\t           with the same Boolean function, only the gate\n" );  
    fprintf( pErr, "\t           with the smallest area will be used)\n" );  
    fprintf( pErr, "\t-W float : wire delay (added to pin-to-pin gate delays) [default = %g]\n", WireDelay );  
    fprintf( pErr, "\t-E file :  the file name with gates to be excluded [default = none]\n" );
    fprintf( pErr, "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n", fShortNames? "yes": "no" );
    fprintf( pErr, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pErr, "\t-h       : enable verbose output\n");
    return 1;       
}